

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

void __thiscall
backward::Printer::print_stacktrace<backward::StackTrace>
          (Printer *this,StackTrace *st,ostream *os,Colorize *colorize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer ppvVar3;
  pointer ppvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  ResolvedTrace local_190;
  ResolvedTrace local_e0;
  
  print_header(this,os,(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                       super_StackTraceImplHolder.super_StackTraceImplBase._thread_id);
  uVar7 = (st->super_StackTraceImpl<backward::system_tag::linux_tag>).super_StackTraceImplHolder.
          super_StackTraceImplBase._skip;
  ppvVar4 = (st->super_StackTraceImpl<backward::system_tag::linux_tag>).super_StackTraceImplHolder.
            _stacktrace.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (long)(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                super_StackTraceImplHolder._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)ppvVar4 >> 3;
  ppvVar4 = ppvVar4 + uVar7;
  if (uVar2 < uVar7 || (pointer)(uVar2 - uVar7) == (pointer)0x0) {
    ppvVar4 = (pointer)0x0;
  }
  ppvVar3 = (pointer)(uVar2 - uVar7);
  if (uVar2 < uVar7) {
    ppvVar3 = (pointer)0x0;
  }
  (*(this->_resolver).super_TraceResolverImpl<backward::system_tag::linux_tag>.
    super_TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>.
    super_TraceResolverLinuxBase.super_TraceResolverImplBase._vptr_TraceResolverImplBase[2])
            (&this->_resolver,ppvVar4,ppvVar3);
  uVar7 = (st->super_StackTraceImpl<backward::system_tag::linux_tag>).super_StackTraceImplHolder.
          super_StackTraceImplBase._skip;
  uVar2 = (long)(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                super_StackTraceImplHolder._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                super_StackTraceImplHolder._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3;
  if (uVar7 < uVar2) {
    paVar1 = &local_190.source.filename.field_2;
    if (uVar2 <= uVar7) {
      uVar7 = uVar2;
    }
    uVar2 = ~uVar7 + uVar2;
    do {
      uVar7 = (st->super_StackTraceImpl<backward::system_tag::linux_tag>).super_StackTraceImplHolder
              .super_StackTraceImplBase._skip;
      ppvVar4 = (st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                super_StackTraceImplHolder._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar5 = (long)(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                    super_StackTraceImplHolder._stacktrace.
                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3;
      uVar6 = uVar5 - uVar7;
      if (uVar5 < uVar7) {
        uVar6 = 0;
      }
      local_190.super_Trace.addr = (void *)0x0;
      local_190.super_Trace.idx = 0;
      if (uVar2 < uVar6) {
        local_190.super_Trace.addr = ppvVar4[uVar7 + uVar2];
        local_190.super_Trace.idx = uVar2;
      }
      local_190.object_filename._M_dataplus._M_p = (pointer)&local_190.object_filename.field_2;
      local_190.object_filename._M_string_length = 0;
      local_190.object_filename.field_2._M_local_buf[0] = '\0';
      local_190.object_function._M_dataplus._M_p = (pointer)&local_190.object_function.field_2;
      local_190.object_function._M_string_length = 0;
      local_190.object_function.field_2._M_local_buf[0] = '\0';
      local_190.source.function._M_dataplus._M_p = (pointer)&local_190.source.function.field_2;
      local_190.source.function._M_string_length = 0;
      local_190.source.function.field_2._M_local_buf[0] = '\0';
      local_190.source.filename._M_string_length = 0;
      local_190.source.filename.field_2._M_local_buf[0] = '\0';
      local_190.inliners.
      super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_190.inliners.
      super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_190.source.line = 0;
      local_190.source.col = 0;
      local_190.inliners.
      super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_190.source.filename._M_dataplus._M_p = (pointer)paVar1;
      TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::resolve
                (&local_e0,
                 (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *)
                 &this->_resolver,&local_190);
      print_trace(this,os,&local_e0,colorize);
      std::
      vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
      ::~vector(&local_e0.inliners);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.source.filename._M_dataplus._M_p != &local_e0.source.filename.field_2) {
        operator_delete(local_e0.source.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.source.function._M_dataplus._M_p != &local_e0.source.function.field_2) {
        operator_delete(local_e0.source.function._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.object_function._M_dataplus._M_p != &local_e0.object_function.field_2) {
        operator_delete(local_e0.object_function._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.object_filename._M_dataplus._M_p != &local_e0.object_filename.field_2) {
        operator_delete(local_e0.object_filename._M_dataplus._M_p);
      }
      std::
      vector<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
      ::~vector(&local_190.inliners);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.source.filename._M_dataplus._M_p != paVar1) {
        operator_delete(local_190.source.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.source.function._M_dataplus._M_p != &local_190.source.function.field_2) {
        operator_delete(local_190.source.function._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.object_function._M_dataplus._M_p != &local_190.object_function.field_2) {
        operator_delete(local_190.object_function._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.object_filename._M_dataplus._M_p != &local_190.object_filename.field_2) {
        operator_delete(local_190.object_filename._M_dataplus._M_p);
      }
      bVar8 = uVar2 != 0;
      uVar2 = uVar2 - 1;
    } while (bVar8);
  }
  return;
}

Assistant:

void print_stacktrace(ST &st, std::ostream &os, Colorize &colorize) {
    print_header(os, st.thread_id());
    _resolver.load_stacktrace(st);
    for (size_t trace_idx = st.size(); trace_idx > 0; --trace_idx) {
      print_trace(os, _resolver.resolve(st[trace_idx - 1]), colorize);
    }
  }